

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O1

void Abc_NtkCovCovers_rec(Cov_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vBoundary)

{
  int iVar1;
  int *piVar2;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  long *plVar3;
  long *plVar4;
  Min_Man_t *pMVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  Vec_Int_t **ppVVar9;
  Vec_Int_t **ppVVar10;
  Vec_Int_t *__ptr;
  Min_Man_t **ppMVar11;
  Min_Cube_t *pMVar12;
  Min_Cube_t *pMVar13;
  Min_Cube_t *pMVar14;
  Min_Cube_t *pMVar15;
  Min_Cube_t *pMVar16;
  void **ppvVar17;
  long lVar18;
  Min_Cube_t **ppMVar19;
  Min_Cube_t **ppMVar20;
  Vec_Int_t *pVVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  
  if ((*(uint *)&pObj->field_0x14 & 0x30) != 0) {
    return;
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x20;
  piVar2 = (pObj->vFanins).pArray;
  ppvVar17 = pObj->pNtk->vObjs->pArray;
  pObj_00 = (Abc_Obj_t *)ppvVar17[*piVar2];
  pObj_01 = (Abc_Obj_t *)ppvVar17[piVar2[1]];
  Abc_NtkCovCovers_rec(p,pObj_00,vBoundary);
  Abc_NtkCovCovers_rec(p,pObj_01,vBoundary);
  if ((pObj_00->field_0x14 & 0x10) != 0) {
LAB_0044912d:
    if ((pObj_01->field_0x14 & 0x10) == 0) {
      iVar22 = pObj_01->Id;
      if (((long)iVar22 < 0) ||
         (lVar18 = *(long *)((long)pObj_01->pNtk->pManCut + 0x18), *(int *)(lVar18 + 4) <= iVar22))
      goto LAB_00449b5a;
      if (*(long *)(*(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8) + 0x18) == 0)
      goto LAB_004497b2;
    }
    piVar2 = (pObj->vFanins).pArray;
    ppvVar17 = pObj->pNtk->vObjs->pArray;
    plVar3 = (long *)ppvVar17[*piVar2];
    plVar4 = (long *)ppvVar17[piVar2[1]];
    if ((*(byte *)((long)plVar3 + 0x14) & 0x10) != 0) {
      if (p->vTriv0->nSize < 1) goto LAB_00449b79;
      *p->vTriv0->pArray = (int)plVar3[2];
    }
    if ((*(byte *)((long)plVar4 + 0x14) & 0x10) != 0) {
      if (p->vTriv1->nSize < 1) {
LAB_00449b79:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *p->vTriv1->pArray = (int)plVar4[2];
    }
    if ((*(byte *)((long)plVar3 + 0x14) & 0x10) == 0) {
      iVar22 = (int)plVar3[2];
      if (((long)iVar22 < 0) ||
         (lVar18 = *(long *)(*(long *)(*plVar3 + 0x110) + 0x18), *(int *)(lVar18 + 4) <= iVar22))
      goto LAB_00449b5a;
      ppVVar9 = (Vec_Int_t **)(*(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8) + 0x18);
    }
    else {
      ppVVar9 = &p->vTriv0;
    }
    if ((*(byte *)((long)plVar4 + 0x14) & 0x10) == 0) {
      iVar22 = (int)plVar4[2];
      if (((long)iVar22 < 0) ||
         (lVar18 = *(long *)(*(long *)(*plVar4 + 0x110) + 0x18), *(int *)(lVar18 + 4) <= iVar22))
      goto LAB_00449b5a;
      ppVVar10 = (Vec_Int_t **)(*(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8) + 0x18);
    }
    else {
      ppVVar10 = &p->vTriv1;
    }
    __ptr = Abc_NodeCovSupport(p,*ppVVar9,*ppVVar10);
    iVar22 = __ptr->nSize;
    if (iVar22 <= p->nFaninMax) {
      uVar25 = *(uint *)&pObj->field_0x14 >> 10 & 1;
      uVar24 = *(uint *)&pObj->field_0x14 >> 0xb & 1;
      if (p->fUseEsop == 0) {
        pMVar12 = (Min_Cube_t *)0x0;
      }
      else {
        if ((*(byte *)((long)plVar3 + 0x14) & 0x10) == 0) {
          iVar1 = (int)plVar3[2];
          if (((long)iVar1 < 0) ||
             (lVar18 = *(long *)(*(long *)(*plVar3 + 0x110) + 0x18), *(int *)(lVar18 + 4) <= iVar1))
          goto LAB_00449b5a;
          ppMVar11 = (Min_Man_t **)((long)iVar1 * 8 + *(long *)(lVar18 + 8));
          lVar18 = 0x10;
        }
        else {
          ppMVar11 = &p->pManMin;
          lVar18 = 0x20;
        }
        pMVar13 = *(Min_Cube_t **)((long)(*ppMVar11)->pTriv0 + lVar18 + -0x20);
        if ((*(byte *)((long)plVar4 + 0x14) & 0x10) == 0) {
          iVar1 = (int)plVar4[2];
          if (((long)iVar1 < 0) ||
             (lVar18 = *(long *)(*(long *)(*plVar4 + 0x110) + 0x18), *(int *)(lVar18 + 4) <= iVar1))
          goto LAB_00449b5a;
          ppMVar11 = (Min_Man_t **)((long)iVar1 * 8 + *(long *)(lVar18 + 8));
          lVar18 = 0x10;
        }
        else {
          ppMVar11 = &p->pManMin;
          lVar18 = 0x30;
        }
        pMVar12 = (Min_Cube_t *)0x0;
        if ((pMVar13 != (Min_Cube_t *)0x0) &&
           (pMVar15 = *(Min_Cube_t **)((long)(*ppMVar11)->pTriv0 + lVar18 + -0x20),
           pMVar15 != (Min_Cube_t *)0x0)) {
          pMVar12 = pMVar13;
          if (uVar25 != 0) {
            if (*(uint *)&pMVar13->field_0x8 < 0x400000) {
              pMVar12 = pMVar13->pNext;
            }
            else {
              pMVar12 = p->pManMin->pOne0;
              pMVar12->pNext = pMVar13;
            }
          }
          pMVar13 = pMVar15;
          if (uVar24 != 0) {
            if (*(uint *)&pMVar15->field_0x8 < 0x400000) {
              pMVar13 = pMVar15->pNext;
            }
            else {
              pMVar13 = p->pManMin->pOne1;
              pMVar13->pNext = pMVar15;
            }
          }
          pMVar12 = Abc_NodeCovProduct(p,pMVar12,pMVar13,1,iVar22);
        }
      }
      if (p->fUseSop == 0) {
        pMVar13 = (Min_Cube_t *)0x0;
      }
      else {
        if ((*(byte *)((long)plVar3 + 0x14) & 0x10) == 0) {
          iVar22 = (int)plVar3[2];
          if (((long)iVar22 < 0) ||
             (lVar18 = *(long *)(*(long *)(*plVar3 + 0x110) + 0x18), *(int *)(lVar18 + 4) <= iVar22)
             ) goto LAB_00449b5a;
          ppMVar19 = (Min_Cube_t **)
                     ((ulong)(uVar25 * 8) + *(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8));
        }
        else {
          ppMVar19 = p->pManMin->pTriv0 + uVar25;
        }
        if ((*(byte *)((long)plVar4 + 0x14) & 0x10) == 0) {
          iVar22 = (int)plVar4[2];
          if (((long)iVar22 < 0) ||
             (lVar18 = *(long *)(*(long *)(*plVar4 + 0x110) + 0x18), *(int *)(lVar18 + 4) <= iVar22)
             ) goto LAB_00449b5a;
          ppMVar20 = (Min_Cube_t **)
                     ((ulong)(uVar24 * 8) + *(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8));
        }
        else {
          ppMVar20 = p->pManMin->pTriv1 + uVar24;
        }
        pMVar13 = (Min_Cube_t *)0x0;
        if ((*ppMVar19 != (Min_Cube_t *)0x0) && (*ppMVar20 != (Min_Cube_t *)0x0)) {
          pMVar13 = Abc_NodeCovProduct(p,*ppMVar19,*ppMVar20,0,__ptr->nSize);
        }
        if ((*(byte *)((long)plVar3 + 0x14) & 0x10) == 0) {
          iVar22 = (int)plVar3[2];
          if (((long)iVar22 < 0) ||
             (lVar18 = *(long *)(*(long *)(*plVar3 + 0x110) + 0x18), *(int *)(lVar18 + 4) <= iVar22)
             ) goto LAB_00449b5a;
          ppMVar19 = (Min_Cube_t **)
                     ((ulong)((uVar25 ^ 1) << 3) +
                     *(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8));
        }
        else {
          ppMVar19 = p->pManMin->pTriv0 + (uVar25 ^ 1);
        }
        pMVar15 = *ppMVar19;
        if ((*(byte *)((long)plVar4 + 0x14) & 0x10) == 0) {
          iVar22 = (int)plVar4[2];
          if (((long)iVar22 < 0) ||
             (lVar18 = *(long *)(*(long *)(*plVar4 + 0x110) + 0x18), *(int *)(lVar18 + 4) <= iVar22)
             ) goto LAB_00449b5a;
          ppMVar19 = (Min_Cube_t **)
                     ((ulong)((uVar24 ^ 1) << 3) +
                     *(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8));
        }
        else {
          ppMVar19 = p->pManMin->pTriv1 + (uVar24 ^ 1);
        }
        if ((pMVar15 != (Min_Cube_t *)0x0) && (pMVar16 = *ppMVar19, pMVar16 != (Min_Cube_t *)0x0)) {
          iVar22 = __ptr->nSize;
          Min_ManClean(p->pManMin,iVar22);
LAB_00449535:
          pMVar5 = p->pManMin;
          pMVar14 = (Min_Cube_t *)Extra_MmFixedEntryFetch(pMVar5->pMemMan);
          pMVar14->pNext = (Min_Cube_t *)0x0;
          uVar24 = pMVar5->nVars & 0x3ff;
          *(uint *)&pMVar14->field_0x8 = *(uint *)&pMVar14->field_0x8 & 0xfffffc00 | uVar24;
          uVar24 = (pMVar5->nWords & 0xfffU) << 10 | uVar24;
          *(uint *)&pMVar14->field_0x8 = uVar24;
          memset(pMVar14->uData,0xff,(long)pMVar5->nWords << 2);
          *(uint *)&pMVar14->field_0x8 = uVar24;
          pVVar21 = p->vComTo0;
          if (0 < pVVar21->nSize) {
            bVar8 = 0;
            uVar23 = 0;
            do {
              iVar1 = pVVar21->pArray[uVar23];
              if ((iVar1 != -1) &&
                 (uVar24 = pMVar15->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) & 3,
                 uVar24 != 3)) {
                pMVar14->uData[uVar23 >> 4 & 0xfffffff] =
                     pMVar14->uData[uVar23 >> 4 & 0xfffffff] ^ (uVar24 ^ 3) << (bVar8 & 0x1e);
                *(int *)&pMVar14->field_0x8 = *(int *)&pMVar14->field_0x8 + 0x400000;
              }
              uVar23 = uVar23 + 1;
              pVVar21 = p->vComTo0;
              bVar8 = bVar8 + 2;
            } while ((long)uVar23 < (long)pVVar21->nSize);
          }
          pMVar5 = p->pManMin;
          if (pMVar5->nCubes <= p->nCubesMax) goto code_r0x0044960a;
          pMVar15 = Min_CoverCollect(pMVar5,iVar22);
          if (pMVar15 != (Min_Cube_t *)0x0) {
            pMVar5 = p->pManMin;
            pMVar16 = pMVar15->pNext;
            while (pMVar14 = pMVar16, Extra_MmFixedEntryRecycle(pMVar5->pMemMan,(char *)pMVar15),
                  pMVar14 != (Min_Cube_t *)0x0) {
              pMVar15 = pMVar14;
              pMVar16 = pMVar14->pNext;
            }
            goto LAB_00449b3a;
          }
          goto LAB_00449b53;
        }
      }
      pMVar16 = (Min_Cube_t *)0x0;
      goto LAB_00449769;
    }
    goto LAB_00449784;
  }
  iVar22 = pObj_00->Id;
  if (((long)iVar22 < 0) ||
     (lVar18 = *(long *)((long)pObj_00->pNtk->pManCut + 0x18), *(int *)(lVar18 + 4) <= iVar22))
  goto LAB_00449b5a;
  if (*(long *)(*(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8) + 0x18) != 0) goto LAB_0044912d;
  goto LAB_004497b2;
code_r0x0044960a:
  Min_SopAddCube(pMVar5,pMVar14);
  pMVar15 = pMVar15->pNext;
  if (pMVar15 == (Min_Cube_t *)0x0) goto LAB_00449624;
  goto LAB_00449535;
LAB_00449624:
  pMVar5 = p->pManMin;
  pMVar15 = (Min_Cube_t *)Extra_MmFixedEntryFetch(pMVar5->pMemMan);
  pMVar15->pNext = (Min_Cube_t *)0x0;
  uVar24 = pMVar5->nVars & 0x3ff;
  *(uint *)&pMVar15->field_0x8 = *(uint *)&pMVar15->field_0x8 & 0xfffffc00 | uVar24;
  uVar24 = (pMVar5->nWords & 0xfffU) << 10 | uVar24;
  *(uint *)&pMVar15->field_0x8 = uVar24;
  memset(pMVar15->uData,0xff,(long)pMVar5->nWords << 2);
  *(uint *)&pMVar15->field_0x8 = uVar24;
  pVVar21 = p->vComTo1;
  if (0 < pVVar21->nSize) {
    bVar8 = 0;
    uVar23 = 0;
    do {
      iVar1 = pVVar21->pArray[uVar23];
      if ((iVar1 != -1) &&
         (uVar24 = pMVar16->uData[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU) & 3, uVar24 != 3)) {
        pMVar15->uData[uVar23 >> 4 & 0xfffffff] =
             pMVar15->uData[uVar23 >> 4 & 0xfffffff] ^ (uVar24 ^ 3) << (bVar8 & 0x1e);
        *(int *)&pMVar15->field_0x8 = *(int *)&pMVar15->field_0x8 + 0x400000;
      }
      uVar23 = uVar23 + 1;
      pVVar21 = p->vComTo1;
      bVar8 = bVar8 + 2;
    } while ((long)uVar23 < (long)pVVar21->nSize);
  }
  pMVar5 = p->pManMin;
  if (pMVar5->nCubes <= p->nCubesMax) goto code_r0x004496f5;
  pMVar15 = Min_CoverCollect(pMVar5,iVar22);
  if (pMVar15 != (Min_Cube_t *)0x0) {
    pMVar5 = p->pManMin;
    pMVar16 = pMVar15->pNext;
    while (pMVar14 = pMVar16, Extra_MmFixedEntryRecycle(pMVar5->pMemMan,(char *)pMVar15),
          pMVar14 != (Min_Cube_t *)0x0) {
      pMVar15 = pMVar14;
      pMVar16 = pMVar14->pNext;
    }
    goto LAB_00449b3a;
  }
  goto LAB_00449b53;
code_r0x004496f5:
  Min_SopAddCube(pMVar5,pMVar15);
  pMVar16 = pMVar16->pNext;
  if (pMVar16 == (Min_Cube_t *)0x0) goto code_r0x00449709;
  goto LAB_00449624;
code_r0x00449709:
  Min_SopMinimize(p->pManMin);
  pMVar16 = Min_CoverCollect(p->pManMin,iVar22);
  iVar22 = 0;
  for (pMVar15 = pMVar16; pMVar15 != (Min_Cube_t *)0x0; pMVar15 = pMVar15->pNext) {
    iVar22 = iVar22 + 1;
  }
  if (p->nFaninMax < iVar22) {
    if (pMVar16 == (Min_Cube_t *)0x0) {
LAB_00449b53:
      pMVar16 = (Min_Cube_t *)0x0;
    }
    else {
      pMVar5 = p->pManMin;
      pMVar15 = pMVar16->pNext;
      while (pMVar14 = pMVar15, Extra_MmFixedEntryRecycle(pMVar5->pMemMan,(char *)pMVar16),
            pMVar14 != (Min_Cube_t *)0x0) {
        pMVar16 = pMVar14;
        pMVar15 = pMVar14->pNext;
      }
LAB_00449b3a:
      pMVar16 = (Min_Cube_t *)0x0;
    }
  }
LAB_00449769:
  if (((pMVar16 != (Min_Cube_t *)0x0) || (pMVar12 != (Min_Cube_t *)0x0)) ||
     (pMVar13 != (Min_Cube_t *)0x0)) {
    iVar22 = pObj->Id;
    lVar18 = (long)iVar22;
    if ((-1 < lVar18) &&
       (lVar6 = *(long *)((long)pObj->pNtk->pManCut + 0x18), iVar22 < *(int *)(lVar6 + 4))) {
      lVar6 = *(long *)(lVar6 + 8);
      lVar7 = *(long *)(lVar6 + lVar18 * 8);
      if (*(long *)(lVar7 + 0x18) != 0) {
        __assert_fail("Abc_ObjGetSupp(pObj) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                      ,0x1bb,"int Abc_NodeCovPropagate(Cov_Man_t *, Abc_Obj_t *)");
      }
      *(Vec_Int_t **)(lVar7 + 0x18) = __ptr;
      **(undefined8 **)(lVar6 + lVar18 * 8) = pMVar13;
      lVar6 = *(long *)((long)pObj->pNtk->pManCut + 0x18);
      if (iVar22 < *(int *)(lVar6 + 4)) {
        *(Min_Cube_t **)(*(long *)(*(long *)(lVar6 + 8) + lVar18 * 8) + 8) = pMVar16;
        lVar6 = *(long *)((long)pObj->pNtk->pManCut + 0x18);
        if (iVar22 < *(int *)(lVar6 + 4)) {
          *(Min_Cube_t **)(*(long *)(*(long *)(lVar6 + 8) + lVar18 * 8) + 0x10) = pMVar12;
          iVar22 = p->nSupps + 1;
          p->nSupps = iVar22;
          if (iVar22 < p->nSuppsMax) {
            iVar22 = p->nSuppsMax;
          }
          p->nSuppsMax = iVar22;
          return;
        }
      }
    }
    goto LAB_00449b5a;
  }
LAB_00449784:
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
LAB_004497b2:
  if ((pObj_00->field_0x14 & 0x10) == 0) {
    iVar22 = pObj_00->Id;
    if (((long)iVar22 < 0) ||
       (lVar18 = *(long *)((long)pObj_00->pNtk->pManCut + 0x18), *(int *)(lVar18 + 4) <= iVar22))
    goto LAB_00449b5a;
    if (*(long *)(*(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8) + 0x18) != 0) {
      uVar24 = vBoundary->nCap;
      if (vBoundary->nSize == uVar24) {
        if ((int)uVar24 < 0x10) {
          if (vBoundary->pArray == (void **)0x0) {
            ppvVar17 = (void **)malloc(0x80);
          }
          else {
            ppvVar17 = (void **)realloc(vBoundary->pArray,0x80);
          }
          vBoundary->pArray = ppvVar17;
          iVar22 = 0x10;
        }
        else {
          iVar22 = uVar24 * 2;
          if (iVar22 <= (int)uVar24) goto LAB_004499af;
          if (vBoundary->pArray == (void **)0x0) {
            ppvVar17 = (void **)malloc((ulong)uVar24 << 4);
          }
          else {
            ppvVar17 = (void **)realloc(vBoundary->pArray,(ulong)uVar24 << 4);
          }
          vBoundary->pArray = ppvVar17;
        }
        vBoundary->nCap = iVar22;
      }
LAB_004499af:
      iVar22 = vBoundary->nSize;
      vBoundary->nSize = iVar22 + 1;
      vBoundary->pArray[iVar22] = pObj_00;
    }
  }
  if ((pObj_01->field_0x14 & 0x10) != 0) {
    return;
  }
  iVar22 = pObj_01->Id;
  if (((long)iVar22 < 0) ||
     (lVar18 = *(long *)((long)pObj_01->pNtk->pManCut + 0x18), *(int *)(lVar18 + 4) <= iVar22)) {
LAB_00449b5a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (*(long *)(*(long *)(*(long *)(lVar18 + 8) + (long)iVar22 * 8) + 0x18) == 0) {
    return;
  }
  uVar24 = vBoundary->nCap;
  if (vBoundary->nSize == uVar24) {
    if ((int)uVar24 < 0x10) {
      if (vBoundary->pArray == (void **)0x0) {
        ppvVar17 = (void **)malloc(0x80);
      }
      else {
        ppvVar17 = (void **)realloc(vBoundary->pArray,0x80);
      }
      vBoundary->pArray = ppvVar17;
      iVar22 = 0x10;
    }
    else {
      iVar22 = uVar24 * 2;
      if (iVar22 <= (int)uVar24) goto LAB_00449a69;
      if (vBoundary->pArray == (void **)0x0) {
        ppvVar17 = (void **)malloc((ulong)uVar24 << 4);
      }
      else {
        ppvVar17 = (void **)realloc(vBoundary->pArray,(ulong)uVar24 << 4);
      }
      vBoundary->pArray = ppvVar17;
    }
    vBoundary->nCap = iVar22;
  }
LAB_00449a69:
  iVar22 = vBoundary->nSize;
  vBoundary->nSize = iVar22 + 1;
  vBoundary->pArray[iVar22] = pObj_01;
  return;
}

Assistant:

void Abc_NtkCovCovers_rec( Cov_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vBoundary )
{
    Abc_Obj_t * pObj0, * pObj1;
    // return if the support is already computed
    if ( pObj->fMarkB || pObj->fMarkA )//|| Abc_ObjGetSupp(pObj) ) // why do we need Supp check here???
        return;
    // mark as visited
    pObj->fMarkB = 1;
    // get the fanins
    pObj0 = Abc_ObjFanin0(pObj);
    pObj1 = Abc_ObjFanin1(pObj);
    // solve for the fanins
    Abc_NtkCovCovers_rec( p, pObj0, vBoundary );
    Abc_NtkCovCovers_rec( p, pObj1, vBoundary );
    // skip the node that spaced out
    if ( (!pObj0->fMarkA && !Abc_ObjGetSupp(pObj0)) ||  // fanin is not ready
         (!pObj1->fMarkA && !Abc_ObjGetSupp(pObj1)) ||  // fanin is not ready
         !Abc_NodeCovPropagate( p, pObj ) )           // node's support or covers cannot be computed
    {
        // save the nodes of the future boundary
        if ( !pObj0->fMarkA && Abc_ObjGetSupp(pObj0) )
            Vec_PtrPush( vBoundary, pObj0 );
        if ( !pObj1->fMarkA && Abc_ObjGetSupp(pObj1) )
            Vec_PtrPush( vBoundary, pObj1 );
        return;
    }
    // consider dropping the fanin supports
//    Abc_NodeCovDropData( p, pObj0 );
//    Abc_NodeCovDropData( p, pObj1 );
}